

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void BundleColorMap_SSE2(uint8_t *row,int width,int xbits,uint32_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ulong uVar5;
  ulong uVar6;
  uint32_t move;
  __m128i shift_1;
  __m128i in_3;
  __m128i res;
  __m128i pack_1;
  __m128i shift;
  __m128i tmp_1;
  __m128i mul_1;
  __m128i in_2;
  __m128i mask_mul;
  __m128i mul_cst;
  __m128i mask_or;
  __m128i dst1_1;
  __m128i dst0_1;
  __m128i pack;
  __m128i tmp;
  __m128i in_1;
  __m128i mul;
  __m128i ff_1;
  __m128i dst3;
  __m128i dst2;
  __m128i in_hi;
  __m128i dst1;
  __m128i dst0;
  __m128i in_lo;
  __m128i in;
  __m128i zero;
  __m128i ff;
  int x;
  int local_414;
  ulong *local_410;
  uint local_2a8;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  byte local_248;
  undefined1 uStack_247;
  byte bStack_246;
  byte bStack_244;
  undefined1 uStack_243;
  byte bStack_242;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 uStack_1b0;
  undefined2 uStack_1ae;
  undefined2 uStack_1ac;
  undefined2 uStack_1aa;
  undefined2 uStack_190;
  undefined2 uStack_18e;
  undefined2 uStack_18c;
  undefined2 uStack_170;
  undefined2 uStack_16e;
  undefined2 uStack_16c;
  byte bStack_160;
  undefined1 uStack_15f;
  byte bStack_15e;
  byte bStack_15c;
  undefined1 uStack_15b;
  byte bStack_15a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  
  local_410 = in_RCX;
  if (in_EDX == 0) {
    for (local_414 = 0; local_414 + 0x10 <= in_ESI; local_414 = local_414 + 0x10) {
      uVar5 = *(ulong *)(in_RDI + local_414);
      uVar6 = ((ulong *)(in_RDI + local_414))[1];
      local_248 = (byte)uVar5;
      uStack_247 = (undefined1)(uVar5 >> 8);
      bStack_246 = (byte)(uVar5 >> 0x10);
      bStack_244 = (byte)(uVar5 >> 0x20);
      uStack_243 = (undefined1)(uVar5 >> 0x28);
      bStack_242 = (byte)(uVar5 >> 0x30);
      local_1d8 = (undefined2)((uint3)local_248 << 8);
      uStack_1d6 = (undefined2)(CONCAT13(uStack_247,(uint3)local_248 << 8) >> 0x10);
      uStack_1d4 = (undefined2)(((uint6)bStack_246 << 0x28) >> 0x20);
      uStack_1d2 = (undefined2)(((uVar5 >> 0x18) << 0x38) >> 0x30);
      uStack_170 = (undefined2)((uint3)bStack_244 << 8);
      uStack_16e = (undefined2)(CONCAT13(uStack_243,(uint3)bStack_244 << 8) >> 0x10);
      uStack_16c = (undefined2)(((uint6)bStack_242 << 0x28) >> 0x20);
      bStack_160 = (byte)uVar6;
      uStack_15f = (undefined1)(uVar6 >> 8);
      bStack_15e = (byte)(uVar6 >> 0x10);
      bStack_15c = (byte)(uVar6 >> 0x20);
      uStack_15b = (undefined1)(uVar6 >> 0x28);
      bStack_15a = (byte)(uVar6 >> 0x30);
      local_1f8 = (undefined2)((uint3)bStack_160 << 8);
      uStack_1f6 = (undefined2)(CONCAT13(uStack_15f,(uint3)bStack_160 << 8) >> 0x10);
      uStack_1f4 = (undefined2)(((uint6)bStack_15e << 0x28) >> 0x20);
      uStack_1f2 = (undefined2)(((uVar6 >> 0x18) << 0x38) >> 0x30);
      uStack_190 = (undefined2)((uint3)bStack_15c << 8);
      uStack_18e = (undefined2)(CONCAT13(uStack_15b,(uint3)bStack_15c << 8) >> 0x10);
      uStack_18c = (undefined2)(((uint6)bStack_15a << 0x28) >> 0x20);
      *local_410 = CONCAT26(0xff00,CONCAT24(uStack_1d6,CONCAT22(0xff00,local_1d8)));
      local_410[1] = CONCAT26(0xff00,CONCAT24(uStack_1d2,CONCAT22(0xff00,uStack_1d4)));
      local_410[2] = CONCAT26(0xff00,CONCAT24(uStack_16e,CONCAT22(0xff00,uStack_170)));
      local_410[3] = CONCAT26(0xff00,CONCAT24((short)(uVar5 >> 0x30),CONCAT22(0xff00,uStack_16c)) &
                                     0xff00ffffffff);
      local_410[4] = CONCAT26(0xff00,CONCAT24(uStack_1f6,CONCAT22(0xff00,local_1f8)));
      local_410[5] = CONCAT26(0xff00,CONCAT24(uStack_1f2,CONCAT22(0xff00,uStack_1f4)));
      local_410[6] = CONCAT26(0xff00,CONCAT24(uStack_18e,CONCAT22(0xff00,uStack_190)));
      local_410[7] = CONCAT26(0xff00,CONCAT24((short)(uVar6 >> 0x30),CONCAT22(0xff00,uStack_18c)) &
                                     0xff00ffffffff);
      local_410 = local_410 + 8;
    }
  }
  else if (in_EDX == 1) {
    for (local_414 = 0; local_414 + 0x10 <= in_ESI; local_414 = local_414 + 0x10) {
      uVar1 = *(undefined8 *)(in_RDI + local_414);
      uVar2 = ((undefined8 *)(in_RDI + local_414))[1];
      local_118 = (short)uVar1;
      sStack_116 = (short)((ulong)uVar1 >> 0x10);
      sStack_114 = (short)((ulong)uVar1 >> 0x20);
      sStack_112 = (short)((ulong)uVar1 >> 0x30);
      sStack_110 = (short)uVar2;
      sStack_10e = (short)((ulong)uVar2 >> 0x10);
      sStack_10c = (short)((ulong)uVar2 >> 0x20);
      sStack_10a = (short)((ulong)uVar2 >> 0x30);
      uVar5 = CONCAT26(sStack_112 * 0x110,
                       CONCAT24(sStack_114 * 0x110,CONCAT22(sStack_116 * 0x110,local_118 * 0x110)))
              & 0xff00ff00ff00ff00;
      uVar6 = CONCAT26(sStack_10a * 0x110,
                       CONCAT24(sStack_10c * 0x110,CONCAT22(sStack_10e * 0x110,sStack_110 * 0x110)))
              & 0xff00ff00ff00ff00;
      local_218 = (undefined2)uVar5;
      uStack_216 = (undefined2)(uVar5 >> 0x10);
      uStack_214 = (undefined2)(uVar5 >> 0x20);
      uStack_212 = (undefined2)(uVar5 >> 0x30);
      uStack_1b0 = (undefined2)uVar6;
      uStack_1ae = (undefined2)(uVar6 >> 0x10);
      uStack_1ac = (undefined2)(uVar6 >> 0x20);
      uStack_1aa = (undefined2)(uVar6 >> 0x30);
      *local_410 = CONCAT26(0xff00,CONCAT24(uStack_216,CONCAT22(0xff00,local_218)));
      local_410[1] = CONCAT26(0xff00,CONCAT24(uStack_212,CONCAT22(0xff00,uStack_214)));
      local_410[2] = CONCAT26(0xff00,CONCAT24(uStack_1ae,CONCAT22(0xff00,uStack_1b0)));
      local_410[3] = CONCAT26(0xff00,CONCAT24(uStack_1aa,CONCAT22(0xff00,uStack_1ac)));
      local_410 = local_410 + 4;
    }
  }
  else if (in_EDX == 2) {
    for (local_414 = 0; local_414 + 0x10 <= in_ESI; local_414 = local_414 + 0x10) {
      uVar1 = *(undefined8 *)(in_RDI + local_414);
      uVar2 = ((undefined8 *)(in_RDI + local_414))[1];
      local_138 = (short)uVar1;
      sStack_136 = (short)((ulong)uVar1 >> 0x10);
      sStack_134 = (short)((ulong)uVar1 >> 0x20);
      sStack_132 = (short)((ulong)uVar1 >> 0x30);
      sStack_130 = (short)uVar2;
      sStack_12e = (short)((ulong)uVar2 >> 0x10);
      sStack_12c = (short)((ulong)uVar2 >> 0x20);
      sStack_12a = (short)((ulong)uVar2 >> 0x30);
      uVar5 = CONCAT26(sStack_132 * 0x104,
                       CONCAT24(sStack_134 * 0x104,CONCAT22(sStack_136 * 0x104,local_138 * 0x104)))
              & 0xf000f000f000f00;
      uVar6 = CONCAT26(sStack_12a * 0x104,
                       CONCAT24(sStack_12c * 0x104,CONCAT22(sStack_12e * 0x104,sStack_130 * 0x104)))
              & 0xf000f000f000f00;
      local_2a8 = (uint)uVar5;
      uStack_2a0 = (uint)uVar6;
      *local_410 = CONCAT44((uint)(uVar5 >> 0x2c),local_2a8 >> 0xc) | uVar5 | 0xff000000ff000000;
      local_410[1] = CONCAT44((uint)(uVar6 >> 0x2c),uStack_2a0 >> 0xc) | uVar6 | 0xff000000ff000000;
      local_410 = local_410 + 2;
    }
  }
  else {
    for (local_414 = 0; local_414 + 0x10 <= in_ESI; local_414 = local_414 + 0x10) {
      uVar5 = ((long *)(in_RDI + local_414))[1];
      auVar3._8_8_ = uVar5;
      auVar3._0_8_ = *(long *)(in_RDI + local_414) << 7;
      uVar4 = (uint)(ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                             (ushort)((byte)(uVar5 >> 7) & 1) << 8 |
                             (ushort)((byte)(uVar5 >> 0xf) & 1) << 9 |
                             (ushort)((byte)(uVar5 >> 0x17) & 1) << 10 |
                             (ushort)((byte)(uVar5 >> 0x1f) & 1) << 0xb |
                             (ushort)((byte)(uVar5 >> 0x27) & 1) << 0xc |
                             (ushort)((byte)(uVar5 >> 0x2f) & 1) << 0xd |
                             (ushort)((byte)(uVar5 >> 0x37) & 1) << 0xe |
                            (ushort)(byte)(uVar5 >> 0x3f) << 0xf);
      *(uint *)local_410 = (uVar4 & 0xff) << 8 | 0xff000000;
      *(uint *)((long)local_410 + 4) = uVar4 & 0xff00 | 0xff000000;
      local_410 = local_410 + 1;
    }
  }
  if (local_414 != in_ESI) {
    VP8LBundleColorMap_C
              ((uint8_t *)(in_RDI + local_414),in_ESI - local_414,in_EDX,(uint32_t *)local_410);
  }
  return;
}

Assistant:

static void BundleColorMap_SSE2(const uint8_t* WEBP_RESTRICT const row,
                                int width, int xbits,
                                uint32_t* WEBP_RESTRICT dst) {
  int x;
  assert(xbits >= 0);
  assert(xbits <= 3);
  switch (xbits) {
    case 0: {
      const __m128i ff = _mm_set1_epi16((short)0xff00);
      const __m128i zero = _mm_setzero_si128();
      // Store 0xff000000 | (row[x] << 8).
      for (x = 0; x + 16 <= width; x += 16, dst += 16) {
        const __m128i in = _mm_loadu_si128((const __m128i*)&row[x]);
        const __m128i in_lo = _mm_unpacklo_epi8(zero, in);
        const __m128i dst0 = _mm_unpacklo_epi16(in_lo, ff);
        const __m128i dst1 = _mm_unpackhi_epi16(in_lo, ff);
        const __m128i in_hi = _mm_unpackhi_epi8(zero, in);
        const __m128i dst2 = _mm_unpacklo_epi16(in_hi, ff);
        const __m128i dst3 = _mm_unpackhi_epi16(in_hi, ff);
        _mm_storeu_si128((__m128i*)&dst[0], dst0);
        _mm_storeu_si128((__m128i*)&dst[4], dst1);
        _mm_storeu_si128((__m128i*)&dst[8], dst2);
        _mm_storeu_si128((__m128i*)&dst[12], dst3);
      }
      break;
    }
    case 1: {
      const __m128i ff = _mm_set1_epi16((short)0xff00);
      const __m128i mul = _mm_set1_epi16(0x110);
      for (x = 0; x + 16 <= width; x += 16, dst += 8) {
        // 0a0b | (where a/b are 4 bits).
        const __m128i in = _mm_loadu_si128((const __m128i*)&row[x]);
        const __m128i tmp = _mm_mullo_epi16(in, mul);  // aba0
        const __m128i pack = _mm_and_si128(tmp, ff);   // ab00
        const __m128i dst0 = _mm_unpacklo_epi16(pack, ff);
        const __m128i dst1 = _mm_unpackhi_epi16(pack, ff);
        _mm_storeu_si128((__m128i*)&dst[0], dst0);
        _mm_storeu_si128((__m128i*)&dst[4], dst1);
      }
      break;
    }
    case 2: {
      const __m128i mask_or = _mm_set1_epi32((int)0xff000000);
      const __m128i mul_cst = _mm_set1_epi16(0x0104);
      const __m128i mask_mul = _mm_set1_epi16(0x0f00);
      for (x = 0; x + 16 <= width; x += 16, dst += 4) {
        // 000a000b000c000d | (where a/b/c/d are 2 bits).
        const __m128i in = _mm_loadu_si128((const __m128i*)&row[x]);
        const __m128i mul = _mm_mullo_epi16(in, mul_cst);  // 00ab00b000cd00d0
        const __m128i tmp = _mm_and_si128(mul, mask_mul);  // 00ab000000cd0000
        const __m128i shift = _mm_srli_epi32(tmp, 12);     // 00000000ab000000
        const __m128i pack = _mm_or_si128(shift, tmp);     // 00000000abcd0000
        // Convert to 0xff00**00.
        const __m128i res = _mm_or_si128(pack, mask_or);
        _mm_storeu_si128((__m128i*)dst, res);
      }
      break;
    }
    default: {
      assert(xbits == 3);
      for (x = 0; x + 16 <= width; x += 16, dst += 2) {
        // 0000000a00000000b... | (where a/b are 1 bit).
        const __m128i in = _mm_loadu_si128((const __m128i*)&row[x]);
        const __m128i shift = _mm_slli_epi64(in, 7);
        const uint32_t move = _mm_movemask_epi8(shift);
        dst[0] = 0xff000000 | ((move & 0xff) << 8);
        dst[1] = 0xff000000 | (move & 0xff00);
      }
      break;
    }
  }
  if (x != width) {
    VP8LBundleColorMap_C(row + x, width - x, xbits, dst);
  }
}